

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::LineDirectiveSyntax::getChild(LineDirectiveSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    break;
  case 1:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    break;
  case 2:
    token_01.info = in_RSI;
    token_01._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_01);
    break;
  case 3:
    token_02.info = in_RSI;
    token_02._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax LineDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return lineNumber;
        case 2: return fileName;
        case 3: return level;
        default: return nullptr;
    }
}